

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees_emit.h
# Opt level: O1

void zng_tr_emit_tree(deflate_state *s,int type,int last)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = s->bi_valid;
  uVar2 = s->bi_buf;
  uVar4 = (ulong)(type + 2U);
  uVar5 = uVar1 + 3;
  bVar3 = (byte)uVar1;
  if ((uVar5 | uVar1) < 0x40) {
    uVar4 = uVar4 << (bVar3 & 0x3f) | uVar2;
  }
  else if (uVar1 < 0x40) {
    *(ulong *)(s->pending_buf + s->pending) = uVar4 << (bVar3 & 0x3f) | uVar2;
    s->pending = s->pending + 8;
    uVar4 = (ulong)(type + 2U >> (-bVar3 & 0x3f));
    uVar5 = uVar1 - 0x3d;
  }
  else {
    *(ulong *)(s->pending_buf + s->pending) = uVar2;
    s->pending = s->pending + 8;
    uVar5 = 3;
  }
  s->bi_valid = uVar5;
  s->bi_buf = uVar4;
  return;
}

Assistant:

static inline void zng_tr_emit_tree(deflate_state *s, int type, const int last) {
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;
    uint32_t header_bits = (type << 1) + last;
    send_bits(s, header_bits, 3, bi_buf, bi_valid);
    cmpr_bits_add(s, 3);
    s->bi_valid = bi_valid;
    s->bi_buf = bi_buf;
    Tracev((stderr, "\n--- Emit Tree: Last: %u\n", last));
}